

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasRepeatedFields(Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  Label LVar3;
  int iVar4;
  FieldDescriptor *this;
  Descriptor *in_RDI;
  int i_1;
  int i;
  int iVar5;
  int index;
  
  iVar5 = 0;
  while( true ) {
    index = iVar5;
    iVar2 = Descriptor::field_count(in_RDI);
    if (iVar2 <= iVar5) {
      iVar5 = 0;
      while( true ) {
        iVar2 = iVar5;
        iVar4 = Descriptor::nested_type_count(in_RDI);
        if (iVar4 <= iVar5) {
          return false;
        }
        Descriptor::nested_type(in_RDI,iVar2);
        bVar1 = HasRepeatedFields((Descriptor *)CONCAT44(index,iVar2));
        if (bVar1) break;
        iVar5 = iVar2 + 1;
      }
      return true;
    }
    this = Descriptor::field(in_RDI,index);
    LVar3 = FieldDescriptor::label(this);
    if (LVar3 == LABEL_REPEATED) break;
    iVar5 = index + 1;
  }
  return true;
}

Assistant:

static bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->label() == FieldDescriptor::LABEL_REPEATED) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasRepeatedFields(descriptor->nested_type(i))) return true;
  }
  return false;
}